

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

int32 mdef_phone_str(mdef_t *m,s3pid_t pid,char *buf)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                  ,0x110,"int32 mdef_phone_str(mdef_t *, s3pid_t, char *)");
  }
  if ((-1 < pid) && (pid < m->n_phone)) {
    *buf = '\0';
    if (pid < m->n_ciphone) {
      pcVar1 = mdef_ciphone_str(m,(s3cipid_t)pid);
      strcpy(buf,pcVar1);
    }
    else {
      pcVar1 = mdef_ciphone_str(m,m->phone[(uint)pid].ci);
      pcVar2 = mdef_ciphone_str(m,m->phone[(uint)pid].lc);
      pcVar3 = mdef_ciphone_str(m,m->phone[(uint)pid].rc);
      sprintf(buf,"%s %s %s %c",pcVar1,pcVar2,pcVar3,
              (ulong)(uint)(int)"ibesu"[m->phone[(uint)pid].wpos]);
    }
    return 0;
  }
  __assert_fail("(pid >= 0) && (pid < m->n_phone)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                ,0x111,"int32 mdef_phone_str(mdef_t *, s3pid_t, char *)");
}

Assistant:

int32
mdef_phone_str(mdef_t * m, s3pid_t pid, char *buf)
{
    char *wpos_name;

    assert(m);
    assert((pid >= 0) && (pid < m->n_phone));
    wpos_name = WPOS_NAME;

    buf[0] = '\0';
    if (pid < m->n_ciphone)
        sprintf(buf, "%s", mdef_ciphone_str(m, (s3cipid_t) pid));
    else {
        sprintf(buf, "%s %s %s %c",
                mdef_ciphone_str(m, m->phone[pid].ci),
                mdef_ciphone_str(m, m->phone[pid].lc),
                mdef_ciphone_str(m, m->phone[pid].rc),
                wpos_name[m->phone[pid].wpos]);
    }
    return 0;
}